

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxc.cxx
# Opt level: O0

void __thiscall
ExchCXX::detail::LibxcKernelImpl::eval_exc_vxc_
          (LibxcKernelImpl *this,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
          const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
          host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,host_buffer_type vtau
          )

{
  bool bVar1;
  string *msg;
  string *in_RDI;
  double *in_stack_00000158;
  double *in_stack_00000160;
  double *in_stack_00000168;
  double *in_stack_00000170;
  size_t in_stack_00000178;
  xc_func_type *in_stack_00000180;
  double *in_stack_00000190;
  double *in_stack_00000198;
  double *in_stack_000001a0;
  double *in_stack_000001a8;
  double *in_stack_000001b0;
  allocator<char> *__a;
  undefined6 in_stack_ffffffffffffff60;
  undefined1 uVar2;
  undefined1 in_stack_ffffffffffffff67;
  LibxcKernelImpl *in_stack_ffffffffffffff90;
  allocator<char> local_61 [81];
  
  throw_if_uninitialized(in_stack_ffffffffffffff90);
  bVar1 = XCKernelImpl::is_mgga((XCKernelImpl *)0x25f7cd);
  if (!bVar1) {
    uVar2 = 1;
    msg = (string *)__cxa_allocate_exception(0x50);
    __a = local_61;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff67,CONCAT16(uVar2,in_stack_ffffffffffffff60)),
               (char *)in_RDI,__a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff67,CONCAT16(uVar2,in_stack_ffffffffffffff60)),
               (char *)in_RDI,__a);
    exchcxx_exception::exchcxx_exception
              ((exchcxx_exception *)
               CONCAT17(in_stack_ffffffffffffff67,CONCAT16(uVar2,in_stack_ffffffffffffff60)),in_RDI,
               (int)((ulong)__a >> 0x20),msg);
    __cxa_throw(msg,&exchcxx_exception::typeinfo,exchcxx_exception::~exchcxx_exception);
  }
  xc_mgga_exc_vxc(in_stack_00000180,in_stack_00000178,in_stack_00000170,in_stack_00000168,
                  in_stack_00000160,in_stack_00000158,in_stack_00000190,in_stack_00000198,
                  in_stack_000001a0,in_stack_000001a8,in_stack_000001b0);
  return;
}

Assistant:

MGGA_EXC_VXC_GENERATOR( LibxcKernelImpl::eval_exc_vxc_ ) const {

  throw_if_uninitialized();
  EXCHCXX_BOOL_CHECK("KERNEL IS NOT MGGA",  is_mgga() );
  xc_mgga_exc_vxc( &kernel_, N, rho, sigma, lapl, tau, eps, vrho, vsigma, vlapl, vtau );

}